

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool __thiscall
tinygltf::TinyGLTF::LoadBinaryFromFile
          (TinyGLTF *this,Model *model,string *err,string *warn,string *filename,uint check_sections
          )

{
  ReadWholeFileFunction p_Var1;
  bool bVar2;
  ostream *poVar3;
  undefined8 uVar4;
  string fileerr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string basedir;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  p_Var1 = (this->fs).ReadWholeFile;
  if (p_Var1 == (ReadWholeFileFunction)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Failed to read file: ",0x15);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,": one or more FS callback not set",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (err != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)err,(string *)&fileerr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileerr._M_dataplus._M_p != &fileerr.field_2) {
        operator_delete(fileerr._M_dataplus._M_p,
                        CONCAT71(fileerr.field_2._M_allocated_capacity._1_7_,
                                 fileerr.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar2 = false;
  }
  else {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fileerr._M_dataplus._M_p = (pointer)&fileerr.field_2;
    fileerr._M_string_length = 0;
    fileerr.field_2._M_local_buf[0] = '\0';
    bVar2 = (*p_Var1)(&data,&fileerr,filename,(this->fs).user_data);
    if (bVar2) {
      GetBaseDir(&basedir,filename);
      if ((long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        uVar4 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fileerr._M_dataplus._M_p != &fileerr.field_2) {
          operator_delete(fileerr._M_dataplus._M_p,
                          CONCAT71(fileerr.field_2._M_allocated_capacity._1_7_,
                                   fileerr.field_2._M_local_buf[0]) + 1);
        }
        if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar4);
      }
      bVar2 = LoadBinaryFromMemory
                        (this,model,err,warn,
                         data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         (uint)((long)data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start),&basedir,
                         check_sections);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)basedir._M_dataplus._M_p != &basedir.field_2) {
        operator_delete(basedir._M_dataplus._M_p,basedir.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Failed to read file: ",0x15);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,fileerr._M_dataplus._M_p,fileerr._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (err != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)err,(string *)&basedir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)basedir._M_dataplus._M_p != &basedir.field_2) {
          operator_delete(basedir._M_dataplus._M_p,basedir.field_2._M_allocated_capacity + 1);
        }
      }
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileerr._M_dataplus._M_p != &fileerr.field_2) {
      operator_delete(fileerr._M_dataplus._M_p,
                      CONCAT71(fileerr.field_2._M_allocated_capacity._1_7_,
                               fileerr.field_2._M_local_buf[0]) + 1);
    }
    if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  return bVar2;
}

Assistant:

bool TinyGLTF::LoadBinaryFromFile(Model *model, std::string *err,
                                  std::string *warn,
                                  const std::string &filename,
                                  unsigned int check_sections) {
  std::stringstream ss;

  if (fs.ReadWholeFile == nullptr) {
    // Programmer error, assert() ?
    ss << "Failed to read file: " << filename
       << ": one or more FS callback not set" << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::vector<unsigned char> data;
  std::string fileerr;
  bool fileread = fs.ReadWholeFile(&data, &fileerr, filename, fs.user_data);
  if (!fileread) {
    ss << "Failed to read file: " << filename << ": " << fileerr << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::string basedir = GetBaseDir(filename);

  bool ret = LoadBinaryFromMemory(model, err, warn, &data.at(0),
                                  static_cast<unsigned int>(data.size()),
                                  basedir, check_sections);

  return ret;
}